

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerSetPagesize(Pager *pPager,u32 *pPageSize,int nReserve)

{
  int iVar1;
  i64 local_38;
  i64 nByte;
  char *pNew;
  int local_20;
  u32 pageSize;
  int rc;
  int nReserve_local;
  u32 *pPageSize_local;
  Pager *pPager_local;
  
  local_20 = 0;
  pNew._4_4_ = *pPageSize;
  pageSize = nReserve;
  _rc = pPageSize;
  pPageSize_local = (u32 *)pPager;
  if ((((pPager->memDb == '\0') || (pPager->dbSize == 0)) &&
      (iVar1 = sqlite3PcacheRefCount(pPager->pPCache), iVar1 == 0)) &&
     ((pNew._4_4_ != 0 && (pNew._4_4_ != (u32)*(undefined8 *)(pPageSize_local + 0x32))))) {
    nByte = 0;
    local_38 = 0;
    if ((*(char *)((long)pPageSize_local + 0x15) != '\0') &&
       (**(long **)(pPageSize_local + 0x12) != 0)) {
      local_20 = sqlite3OsFileSize(*(sqlite3_file **)(pPageSize_local + 0x12),&local_38);
    }
    if (local_20 == 0) {
      nByte = (i64)sqlite3PageMalloc(pNew._4_4_ + 8);
      if ((void *)nByte == (void *)0x0) {
        local_20 = 7;
      }
      else {
        memset((void *)(nByte + (ulong)pNew._4_4_),0,8);
      }
    }
    if (local_20 == 0) {
      pager_reset((Pager *)pPageSize_local);
      local_20 = sqlite3PcacheSetPageSize(*(PCache **)(pPageSize_local + 0x48),pNew._4_4_);
    }
    if (local_20 == 0) {
      sqlite3PageFree(*(void **)(pPageSize_local + 0x46));
      *(i64 *)(pPageSize_local + 0x46) = nByte;
      pPageSize_local[8] =
           (u32)((long)(local_38 + (ulong)pNew._4_4_ + -1) / (long)(ulong)pNew._4_4_);
      *(ulong *)(pPageSize_local + 0x32) = (ulong)pNew._4_4_;
      pPageSize_local[0x30] = (uint)sqlite3PendingByte / pNew._4_4_ + 1;
    }
    else {
      sqlite3PageFree((void *)nByte);
    }
  }
  *_rc = (u32)*(undefined8 *)(pPageSize_local + 0x32);
  if (local_20 == 0) {
    if ((int)pageSize < 0) {
      pageSize = (u32)*(short *)((long)pPageSize_local + 0xb2);
    }
    *(short *)((long)pPageSize_local + 0xb2) = (short)pageSize;
    pagerFixMaplimit((Pager *)pPageSize_local);
  }
  return local_20;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerSetPagesize(Pager *pPager, u32 *pPageSize, int nReserve){
  int rc = SQLITE_OK;

  /* It is not possible to do a full assert_pager_state() here, as this
  ** function may be called from within PagerOpen(), before the state
  ** of the Pager object is internally consistent.
  **
  ** At one point this function returned an error if the pager was in
  ** PAGER_ERROR state. But since PAGER_ERROR state guarantees that
  ** there is at least one outstanding page reference, this function
  ** is a no-op for that case anyhow.
  */

  u32 pageSize = *pPageSize;
  assert( pageSize==0 || (pageSize>=512 && pageSize<=SQLITE_MAX_PAGE_SIZE) );
  if( (pPager->memDb==0 || pPager->dbSize==0)
   && sqlite3PcacheRefCount(pPager->pPCache)==0
   && pageSize && pageSize!=(u32)pPager->pageSize
  ){
    char *pNew = NULL;             /* New temp space */
    i64 nByte = 0;

    if( pPager->eState>PAGER_OPEN && isOpen(pPager->fd) ){
      rc = sqlite3OsFileSize(pPager->fd, &nByte);
    }
    if( rc==SQLITE_OK ){
      /* 8 bytes of zeroed overrun space is sufficient so that the b-tree
      * cell header parser will never run off the end of the allocation */
      pNew = (char *)sqlite3PageMalloc(pageSize+8);
      if( !pNew ){
        rc = SQLITE_NOMEM_BKPT;
      }else{
        memset(pNew+pageSize, 0, 8);
      }
    }

    if( rc==SQLITE_OK ){
      pager_reset(pPager);
      rc = sqlite3PcacheSetPageSize(pPager->pPCache, pageSize);
    }
    if( rc==SQLITE_OK ){
      sqlite3PageFree(pPager->pTmpSpace);
      pPager->pTmpSpace = pNew;
      pPager->dbSize = (Pgno)((nByte+pageSize-1)/pageSize);
      pPager->pageSize = pageSize;
      pPager->lckPgno = (Pgno)(PENDING_BYTE/pageSize) + 1;
    }else{
      sqlite3PageFree(pNew);
    }
  }

  *pPageSize = pPager->pageSize;
  if( rc==SQLITE_OK ){
    if( nReserve<0 ) nReserve = pPager->nReserve;
    assert( nReserve>=0 && nReserve<1000 );
    pPager->nReserve = (i16)nReserve;
    pagerFixMaplimit(pPager);
  }
  return rc;
}